

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O0

void * lj_lightud_intern(lua_State *L,void *p)

{
  uint32_t uVar1;
  GCSize osz;
  ulong uVar2;
  ulong in_RSI;
  void *in_RDI;
  MSize seg;
  MSize segnum;
  uint32_t *segmap;
  uint32_t up;
  uint64_t u;
  global_State *g;
  ErrMsg in_stack_ffffffffffffff9c;
  GCSize in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_40;
  uint local_3c;
  lua_State *local_38;
  
  uVar2 = (ulong)*(uint *)((long)in_RDI + 8);
  uVar1 = (uint32_t)((in_RSI >> 0x27) << 7);
  local_38 = (lua_State *)(ulong)*(uint *)(uVar2 + 0x88);
  local_3c = (uint)*(byte *)(uVar2 + 0x5b);
  if (local_38 != (lua_State *)0x0) {
    for (local_40 = 0; local_40 <= local_3c; local_40 = local_40 + 1) {
      if ((&local_38->nextgc)[local_40].gcptr32 == uVar1) {
        return (void *)((ulong)local_40 << 0x27 | in_RSI & 0x7fffffffff);
      }
    }
    local_3c = local_3c + 1;
    if (0xfe < local_3c) {
      lj_err_msg((lua_State *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    }
  }
  if (((local_3c - 1 & local_3c) == 0) && (local_3c != 1)) {
    if (local_3c == 0) {
      osz = 2;
    }
    else {
      osz = local_3c << 1;
    }
    local_38 = (lua_State *)lj_mem_realloc(local_38,in_RDI,osz,in_stack_ffffffffffffffa0);
    *(int *)(uVar2 + 0x88) = (int)local_38;
  }
  *(char *)(uVar2 + 0x5b) = (char)local_3c;
  (&local_38->nextgc)[local_3c].gcptr32 = uVar1;
  return (void *)((ulong)local_3c << 0x27 | in_RSI & 0x7fffffffff);
}

Assistant:

void *lj_lightud_intern(lua_State *L, void *p)
{
  global_State *g = G(L);
  uint64_t u = (uint64_t)p;
  uint32_t up = lightudup(u);
  uint32_t *segmap = mref(g->gc.lightudseg, uint32_t);
  MSize segnum = g->gc.lightudnum;
  if (segmap) {
    MSize seg;
    for (seg = 0; seg <= segnum; seg++)
      if (segmap[seg] == up)  /* Fast path. */
	return (void *)(((uint64_t)seg << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
    segnum++;
    /* Leave last segment unused to avoid clash with ITERN key. */
    if (segnum >= (1 << LJ_LIGHTUD_BITS_SEG)-1) lj_err_msg(L, LJ_ERR_BADLU);
  }
  if (!((segnum-1) & segnum) && segnum != 1) {
    lj_mem_reallocvec(L, segmap, segnum, segnum ? 2*segnum : 2u, uint32_t);
    setmref(g->gc.lightudseg, segmap);
  }
  g->gc.lightudnum = segnum;
  segmap[segnum] = up;
  return (void *)(((uint64_t)segnum << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
}